

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::fractional_part(sequence *__return_storage_ptr__,spec *s)

{
  sequence sStack_48;
  character local_28;
  
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0045b940;
  local_28.value_ = '.';
  zero_prefixable_int(&sStack_48,s);
  sequence::sequence<toml::detail::character,toml::detail::sequence>
            (__return_storage_ptr__,&local_28,&sStack_48);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&sStack_48.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence fractional_part(const spec& s)
{
    return sequence(
            character('.'),
            zero_prefixable_int(s)
        );
}